

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O0

void __thiscall
ManifestTest_normalize_path_bad_working_directory_Test::TestBody
          (ManifestTest_normalize_path_bad_working_directory_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_9a0;
  Message local_998;
  allocator local_989;
  string local_988;
  allocator local_961;
  string local_960;
  string local_940;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_16;
  Message local_908;
  allocator local_8f9;
  string local_8f8;
  allocator local_8d1;
  string local_8d0;
  string local_8b0;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_15;
  Message local_878;
  allocator local_869;
  string local_868;
  allocator local_841;
  string local_840;
  string local_820;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_14;
  Message local_7e8;
  allocator local_7d9;
  string local_7d8;
  allocator local_7b1;
  string local_7b0;
  string local_790;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_13;
  Message local_758;
  allocator local_749;
  string local_748;
  allocator local_721;
  string local_720;
  string local_700;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_12;
  Message local_6c8;
  allocator local_6b9;
  string local_6b8;
  allocator local_691;
  string local_690;
  string local_670;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_11;
  Message local_638;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  string local_5e0;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_10;
  Message local_5a8;
  allocator local_599;
  string local_598;
  allocator local_571;
  string local_570;
  string local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_9;
  Message local_518;
  allocator local_509;
  string local_508;
  allocator local_4e1;
  string local_4e0;
  string local_4c0;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_8;
  Message local_488;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  string local_430;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_7;
  Message local_3f8;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  string local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_6;
  Message local_368;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  string local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_5;
  Message local_2d8;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  string local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_4;
  Message local_248;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_3;
  Message local_1b8;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  string local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_2;
  Message local_128;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ManifestTest_normalize_path_bad_working_directory_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",&local_89);
  normalize(&local_40,&local_60,&local_88);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_20,"normalize(\"\", \"\")","\"<failed to normalize>\"",&local_40,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"k",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"",&local_119);
  normalize(&local_d0,&local_f0,&local_118);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_b0,"normalize(\"k\", \"\")","\"<failed to normalize>\"",&local_d0,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,".",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"",&local_1a9);
  normalize(&local_160,&local_180,&local_1a8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_140,"normalize(\".\", \"\")","\"<failed to normalize>\"",&local_160,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"..",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"",&local_239);
  normalize(&local_1f0,&local_210,&local_238);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_1d0,"normalize(\"..\", \"\")","\"<failed to normalize>\"",&local_1f0,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"/",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"",&local_2c9);
  normalize(&local_280,&local_2a0,&local_2c8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_260,"normalize(\"/\", \"\")","\"/\"",&local_280,
             (char (*) [2])0x26de55);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"",&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_358,"k",&local_359);
  normalize(&local_310,&local_330,&local_358);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_2f0,"normalize(\"\", \"k\")","\"<failed to normalize>\"",&local_310,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"k",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"k",&local_3e9);
  normalize(&local_3a0,&local_3c0,&local_3e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_380,"normalize(\"k\", \"k\")","\"<failed to normalize>\"",&local_3a0,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"..",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"k",&local_479);
  normalize(&local_430,&local_450,&local_478);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_410,"normalize(\"..\", \"k\")","\"<failed to normalize>\"",&local_430
             ,(char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"/",&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_508,"k",&local_509);
  normalize(&local_4c0,&local_4e0,&local_508);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_4a0,"normalize(\"/\", \"k\")","\"/k\"",&local_4c0,
             (char (*) [3])0x26ddba);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_570,"",&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_598,".",&local_599);
  normalize(&local_550,&local_570,&local_598);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_530,"normalize(\"\", \".\")","\"<failed to normalize>\"",&local_550,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_5a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"k",&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,".",&local_629);
  normalize(&local_5e0,&local_600,&local_628);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_5c0,"normalize(\"k\", \".\")","\"<failed to normalize>\"",&local_5e0,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_690,"..",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b8,".",&local_6b9);
  normalize(&local_670,&local_690,&local_6b8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_650,"normalize(\"..\", \".\")","\"<failed to normalize>\"",&local_670
             ,(char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_720,"/",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_748,".",&local_749);
  normalize(&local_700,&local_720,&local_748);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_6e0,"normalize(\"/\", \".\")","\"/\"",&local_700,
             (char (*) [2])0x26de55);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7b0,"",&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7d8,"..",&local_7d9);
  normalize(&local_790,&local_7b0,&local_7d8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_770,"normalize(\"\", \"..\")","\"<failed to normalize>\"",&local_790,
             (char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_840,"k",&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_868,"..",&local_869);
  normalize(&local_820,&local_840,&local_868);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_800,"normalize(\"k\", \"..\")","\"<failed to normalize>\"",&local_820
             ,(char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d0,"..",&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f8,"..",&local_8f9);
  normalize(&local_8b0,&local_8d0,&local_8f8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[22],_nullptr>
            ((EqHelper *)local_890,"normalize(\"..\", \"..\")","\"<failed to normalize>\"",
             &local_8b0,(char (*) [22])"<failed to normalize>");
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_960,"/",&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_988,"..",&local_989);
  normalize(&local_940,&local_960,&local_988);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_920,"normalize(\"/\", \"..\")","\"/\"",&local_940,
             (char (*) [2])0x26de55);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar1) {
    testing::Message::Message(&local_998);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9a0,&local_998);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  return;
}

Assistant:

TEST(ManifestTest, normalize_path_bad_working_directory) {
  EXPECT_EQ(normalize("", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("k", ""), "<failed to normalize>");
  EXPECT_EQ(normalize(".", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("..", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("/", ""), "/");

  EXPECT_EQ(normalize("", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("k", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("..", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("/", "k"), "/k");

  EXPECT_EQ(normalize("", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("k", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("..", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("/", "."), "/");

  EXPECT_EQ(normalize("", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("k", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("..", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("/", ".."), "/");
}